

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O0

void __thiscall TPZGenSubStruct::SubStructure(TPZGenSubStruct *this)

{
  TPZGeoEl *pTVar1;
  int iVar2;
  int iVar3;
  TPZCompMesh *pTVar4;
  TPZGeoMesh *this_00;
  int64_t iVar5;
  TPZGeoEl **ppTVar6;
  int64_t iVar7;
  TPZCompEl *pTVar8;
  long *plVar9;
  TPZCompElSide *this_01;
  TPZCompEl **ppTVar10;
  long lVar11;
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_02;
  long in_RDI;
  TPZSubCompMesh *submesh_2;
  TPZCompEl *cel_2;
  TPZSimpleTimer timeformakeallinternal;
  int ic;
  int nc;
  TPZSubCompMesh *submesh_1;
  TPZCompEl *cel_1;
  int conindex;
  TPZCompEl *cel;
  TPZCompEl *celpoint;
  int sub;
  TPZSubCompMesh *submesh;
  TPZCompMesh *cmesh;
  TPZCompElSide celside;
  int nelstack;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> subels;
  TPZGeoEl *gel;
  int iel;
  int nel;
  TPZGeoMesh *gmesh;
  TPZSimpleTimer timesubstructuring;
  TPZGeoEl *in_stack_fffffffffffffbf0;
  TPZSimpleTimer *in_stack_fffffffffffffbf8;
  TPZSimpleTimer *pTVar12;
  TPZCompMesh *in_stack_fffffffffffffc00;
  TPZCompElSide *in_stack_fffffffffffffc08;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffc10;
  TPZCompMesh *in_stack_fffffffffffffc48;
  TPZSubCompMesh *in_stack_fffffffffffffc50;
  long *local_3a0;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  TPZStack<TPZCompElSide,_10> *in_stack_fffffffffffffd68;
  TPZGeoElSide *in_stack_fffffffffffffd70;
  int local_210;
  int local_1f4;
  TPZCompEl *local_1e8;
  string local_1e0 [60];
  int local_1a4;
  long *local_1a0;
  TPZCompMesh *local_198;
  TPZCompElSide local_190;
  TPZCompElSide local_180;
  int local_16c;
  TPZVec<TPZCompElSide> local_150 [2];
  TPZSimpleTimer *in_stack_fffffffffffffef0;
  int local_84;
  
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)in_stack_fffffffffffffc10);
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  this_00 = TPZCompMesh::Reference(pTVar4);
  iVar5 = TPZGeoMesh::NElements((TPZGeoMesh *)0x200ea1b);
  for (local_84 = 0; local_84 < (int)iVar5; local_84 = local_84 + 1) {
    TPZGeoMesh::ElementVec(this_00);
    ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZGeoEl_*,_10> *)in_stack_fffffffffffffc10,
                         (int64_t)in_stack_fffffffffffffc08);
    pTVar1 = *ppTVar6;
    iVar2 = TPZGeoEl::Level(in_stack_fffffffffffffbf0);
    if (iVar2 == *(int *)(in_RDI + 0x30)) {
      TPZStack<TPZCompElSide,_10>::TPZStack
                ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffc00);
      (**(code **)(*(long *)pTVar1 + 0xf0))();
      TPZGeoElSide::TPZGeoElSide
                ((TPZGeoElSide *)in_stack_fffffffffffffc00,(TPZGeoEl *)in_stack_fffffffffffffbf8,
                 (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
      TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffc00);
      TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
      TPZCompMesh::LoadReferences(in_stack_fffffffffffffc00);
      TPZGeoElSide::HigherLevelCompElementList2
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                 in_stack_fffffffffffffd60);
      iVar7 = TPZVec<TPZCompElSide>::NElements(local_150);
      local_16c = (int)iVar7;
      if (local_16c == 0) {
        TPZGeoElSide::Reference((TPZGeoElSide *)in_stack_fffffffffffffbf8);
        pTVar8 = TPZCompElSide::Element(&local_180);
        if (pTVar8 != (TPZCompEl *)0x0) {
          TPZCompElSide::TPZCompElSide(&local_190,&local_180);
          TPZStack<TPZCompElSide,_10>::Push
                    ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffc00,
                     (TPZCompElSide *)in_stack_fffffffffffffbf8);
          local_16c = 1;
        }
      }
      local_198 = TPZAutoPointer<TPZCompMesh>::operator->
                            ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
      plVar9 = (long *)operator_new(0xa78);
      TPZSubCompMesh::TPZSubCompMesh(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_1a0 = plVar9;
      std::operator<<((ostream *)&std::cout,'*');
      std::ostream::flush();
      for (local_1a4 = 0; local_1a4 < local_16c; local_1a4 = local_1a4 + 1) {
        TPZVec<TPZCompElSide>::operator[](local_150,(long)local_1a4);
        TPZCompElSide::Reference(in_stack_fffffffffffffc08);
        iVar3 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffbf0);
        iVar2 = *(int *)(in_RDI + 0x28);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x200ed7f);
        pTVar4 = local_198;
        plVar9 = local_1a0;
        if (iVar3 == iVar2) {
          this_01 = TPZVec<TPZCompElSide>::operator[](local_150,(long)local_1a4);
          pTVar8 = TPZCompElSide::Element(this_01);
          iVar7 = TPZCompEl::Index(pTVar8);
          (**(code **)(*plVar9 + 200))(plVar9,pTVar4,iVar7);
        }
      }
      (**(code **)(*local_1a0 + 0x60))();
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x200eead);
      TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x200eeba);
    }
  }
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_(in_stack_fffffffffffffbf8);
  std::operator<<((ostream *)&std::cout,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  iVar5 = TPZCompMesh::NElements((TPZCompMesh *)0x200ef55);
  local_1e8 = (TPZCompEl *)0x0;
  for (local_84 = 0; pTVar8 = local_1e8, local_84 < (int)iVar5; local_84 = local_84 + 1) {
    pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38))
    ;
    TPZCompMesh::ElementVec(pTVar4);
    ppTVar10 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                         (in_stack_fffffffffffffc10,(int64_t)in_stack_fffffffffffffc08);
    pTVar8 = *ppTVar10;
    if ((pTVar8 != (TPZCompEl *)0x0) &&
       (iVar2 = (**(code **)(*(long *)pTVar8 + 0xb0))(), iVar2 == 0)) break;
  }
  local_1e8 = pTVar8;
  if (local_1e8 != (TPZCompEl *)0x0) {
    local_1f4 = (**(code **)(*(long *)local_1e8 + 0xa0))(local_1e8,0);
    for (local_84 = 0; local_84 < (int)iVar5; local_84 = local_84 + 1) {
      pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->
                         ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
      TPZCompMesh::ElementVec(pTVar4);
      ppTVar10 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                           (in_stack_fffffffffffffc10,(int64_t)in_stack_fffffffffffffc08);
      pTVar8 = *ppTVar10;
      if (pTVar8 != (TPZCompEl *)0x0) {
        if (pTVar8 == (TPZCompEl *)0x0) {
          local_3a0 = (long *)0x0;
        }
        else {
          local_3a0 = (long *)__dynamic_cast(pTVar8,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                             0x918);
        }
        if (local_3a0 != (long *)0x0) {
          iVar2 = (**(code **)(*local_3a0 + 0x180))();
          for (local_210 = 0; local_210 < iVar2; local_210 = local_210 + 1) {
            lVar11 = (**(code **)(*local_3a0 + 0x178))(local_3a0,local_210);
            if (lVar11 == local_1f4) {
              pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->
                                 ((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
              iVar7 = TPZCompEl::Index(local_1e8);
              (**(code **)(*local_3a0 + 200))(local_3a0,pTVar4,iVar7);
              local_1e8 = (TPZCompEl *)0x0;
              local_1f4 = -1;
              break;
            }
          }
          if (local_1e8 == (TPZCompEl *)0x0) break;
        }
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"Making Internal");
  TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  iVar5 = TPZCompMesh::NElements((TPZCompMesh *)0x200f314);
  std::operator<<((ostream *)&std::cout,"Make all Internal \n");
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)in_stack_fffffffffffffc10);
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  (**(code **)(*(long *)pTVar4 + 0x78))();
  for (local_84 = 0; local_84 < (int)iVar5; local_84 = local_84 + 1) {
    pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38))
    ;
    this_02 = TPZCompMesh::ElementVec(pTVar4);
    in_stack_fffffffffffffc08 =
         (TPZCompElSide *)
         TPZChunkVector<TPZCompEl_*,_10>::operator[]
                   (&this_02->super_TPZChunkVector<TPZCompEl_*,_10>,
                    (int64_t)in_stack_fffffffffffffc08);
    pTVar8 = in_stack_fffffffffffffc08->fEl;
    if (pTVar8 != (TPZCompEl *)0x0) {
      if (pTVar8 == (TPZCompEl *)0x0) {
        in_stack_fffffffffffffbf8 = (TPZSimpleTimer *)0x0;
      }
      else {
        in_stack_fffffffffffffbf8 =
             (TPZSimpleTimer *)
             __dynamic_cast(pTVar8,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      }
      if (in_stack_fffffffffffffbf8 != (TPZSimpleTimer *)0x0) {
        pTVar12 = in_stack_fffffffffffffbf8;
        std::operator<<((ostream *)&std::cout,'-');
        std::ostream::flush();
        (**(code **)(*(long *)&in_stack_fffffffffffffbf8->fName + 0xa8))();
        in_stack_fffffffffffffbf8 = pTVar12;
      }
    }
  }
  std::operator<<((ostream *)&std::cout," == Finished\n");
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x38));
  (**(code **)(*(long *)pTVar4 + 0x88))();
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_(in_stack_fffffffffffffbf8);
  std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffd60);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_fffffffffffffef0);
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void TPZGenSubStruct::SubStructure()
{
	TPZSimpleTimer timesubstructuring; // init of timer for substructuring mesh
	
	TPZGeoMesh *gmesh = fCMesh->Reference();
	int nel = gmesh->NElements();
	int iel;
	for(iel=0; iel<nel; iel++)
	{
		TPZGeoEl *gel = gmesh->ElementVec()[iel];
		if(gel->Level() == this->fSubstructLevel)
		{
			TPZStack<TPZCompElSide> subels;
			TPZGeoElSide gelside(gel,gel->NSides()-1);
			gmesh->ResetReference();
			fCMesh->LoadReferences();
			gelside.HigherLevelCompElementList2(subels,0,0);
			int nelstack = subels.NElements();
			if(!nelstack)
			{
				TPZCompElSide celside = gelside.Reference();
				if(celside.Element()) 
				{
					subels.Push(celside);
					nelstack = 1;
				}
			}
			TPZCompMesh *cmesh = fCMesh.operator->();
			TPZSubCompMesh *submesh = new TPZSubCompMesh(*cmesh);
			std::cout << '*';
			std::cout.flush();
			int sub;
			for(sub=0; sub<nelstack; sub++)
			{
				if(subels[sub].Reference().Dimension() == fDimension)
				{
					submesh->TransferElement(cmesh,subels[sub].Element()->Index());
#ifdef PZDEBUG 
					submesh->VerifyDatastructureConsistency();
#endif
				}
			}
			submesh->ExpandSolution();
		}
	}
	
	std::cout << timesubstructuring.ReturnTimeString(); // end of timer for substructuring mesh
	
	// transfer the point load
	// find the point elements
	nel = fCMesh->NElements();
	TPZCompEl *celpoint = 0;
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Dimension() == 0) 
		{
			celpoint = cel;
			break;
		}
	}
	if(celpoint)
	{
		int conindex = celpoint->ConnectIndex(0);
		for(iel=0; iel<nel; iel++)
		{
			TPZCompEl *cel = fCMesh->ElementVec()[iel];
			if(!cel) continue;
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
			if(!submesh) continue;
			int nc = submesh->NConnects();
			int ic;
			for(ic=0; ic<nc; ic++)
			{
				if(submesh->ConnectIndex(ic) == conindex)
				{
					submesh->TransferElement(fCMesh.operator->(),celpoint->Index());
					celpoint = 0;
					conindex = -1;
					break;
				}
			}
			if(!celpoint) break;
		}
	}
	
	//#define MAKEINTERNAL
#ifdef MAKEINTERNAL
	std::cout << "Making Internal";
	// make all nodes internal
	nel = fCMesh->NElements();
	
	std::cout << "Make all Internal \n";
	TPZSimpleTimer timeformakeallinternal; // init for timer
	fCMesh->ComputeNodElCon();
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
		if(!submesh) continue;
		std::cout << '-'; std::cout.flush();
		submesh->MakeAllInternal();
	}
	std::cout << " == Finished\n";
	fCMesh->CleanUpUnconnectedNodes();
	
	std::cout << timeformakeallinternal.ReturnTimeString();
#endif
}